

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_fop_DD(DisasContext_conflict8 *dc,int rd,int rs,
               _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_i32_conflict *gen)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i32 v;
  TCGv_i32 src;
  TCGv_i32 dst;
  TCGContext_conflict8 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_i32_conflict *gen_local;
  int rs_local;
  int rd_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  pTVar1 = gen_load_fpr_D(dc,rs);
  v = gen_dest_fpr_D(dc,rd);
  (*gen)(tcg_ctx_00,v,tcg_ctx_00->cpu_env,pTVar1);
  gen_helper_check_ieee_exceptions(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fsr,tcg_ctx_00->cpu_env);
  gen_store_fpr_D(dc,rd,v);
  return;
}

Assistant:

static inline void gen_fop_DD(DisasContext *dc, int rd, int rs,
                              void (*gen)(TCGContext *, TCGv_i64, TCGv_ptr, TCGv_i64))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst, src;

    src = gen_load_fpr_D(dc, rs);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, tcg_ctx->cpu_env, src);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_store_fpr_D(dc, rd, dst);
}